

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

void MOJOSHADER_effectSetTechnique(MOJOSHADER_effect *effect,MOJOSHADER_effectTechnique *technique)

{
  int local_1c;
  int i;
  MOJOSHADER_effectTechnique *technique_local;
  MOJOSHADER_effect *effect_local;
  
  local_1c = 0;
  while( true ) {
    if (effect->technique_count <= local_1c) {
      __assert_fail("0 && \"Technique is not part of this effect!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0x6a9,
                    "void MOJOSHADER_effectSetTechnique(MOJOSHADER_effect *, const MOJOSHADER_effectTechnique *)"
                   );
    }
    if (technique == effect->techniques + local_1c) break;
    local_1c = local_1c + 1;
  }
  effect->current_technique = technique;
  return;
}

Assistant:

void MOJOSHADER_effectSetTechnique(MOJOSHADER_effect *effect,
                                   const MOJOSHADER_effectTechnique *technique)
{
    int i;
    for (i = 0; i < effect->technique_count; i++)
    {
        if (technique == &effect->techniques[i])
        {
            effect->current_technique = technique;
            return;
        } // if
    } // for
    assert(0 && "Technique is not part of this effect!");
}